

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O3

void satellite_info_cleanup(satellite_info *info)

{
  int iVar1;
  char **__ptr;
  long lVar2;
  
  __ptr = info->observable;
  if (__ptr != (char **)0x0) {
    iVar1 = info->num_observables;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (info->observable[lVar2] != (char *)0x0) {
          free(info->observable[lVar2]);
          iVar1 = info->num_observables;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      __ptr = info->observable;
    }
    free(__ptr);
  }
  if (info->sat_obs_definition != (coda_type_record *)0x0) {
    coda_type_release((coda_type *)info->sat_obs_definition);
  }
  if (info->sat_obs_array_definition != (coda_type_array *)0x0) {
    coda_type_release((coda_type *)info->sat_obs_array_definition);
  }
  if (info->sat_obs_array != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->sat_obs_array);
  }
  if (info->records != (coda_mem_array *)0x0) {
    coda_dynamic_type_delete((coda_dynamic_type *)info->records);
    return;
  }
  return;
}

Assistant:

static void satellite_info_cleanup(satellite_info *info)
{
    int i;

    if (info->observable != NULL)
    {
        for (i = 0; i < info->num_observables; i++)
        {
            if (info->observable[i] != NULL)
            {
                free(info->observable[i]);
            }
        }
        free(info->observable);
    }
    if (info->sat_obs_definition != NULL)
    {
        coda_type_release((coda_type *)info->sat_obs_definition);
    }
    if (info->sat_obs_array_definition != NULL)
    {
        coda_type_release((coda_type *)info->sat_obs_array_definition);
    }
    if (info->sat_obs_array != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->sat_obs_array);
    }
    if (info->records != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)info->records);
    }
}